

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildProfiledElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>_>
  *pOVar4;
  OpCode local_2a [4];
  OpCode newOpcode_local;
  
  local_2a[0] = newOpcode;
  bVar2 = OpCodeAttr::IsProfiledOp(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0xf92,"(OpCodeAttr::IsProfiledOp(newOpcode))",
                       "OpCodeAttr::IsProfiledOp(newOpcode)");
    if (!bVar2) goto LAB_004a87a0;
    *puVar3 = 0;
  }
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0xf93,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) {
LAB_004a87a0:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pOVar4 = Js::ByteCodeReader::
           GetLayout<Js::OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>>
                     (&this->m_jnReader);
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,ClosureRegCheckPhase,sourceContextId,functionId);
  if (!bVar2) {
    DoClosureRegCheck(this,(uint)(pOVar4->
                                 super_OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>
                                 ).Value);
  }
  Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(local_2a);
  BuildElementSlotI2(this,local_2a[0],offset,
                     (uint)(pOVar4->
                           super_OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
                           Value,
                     (uint)(pOVar4->
                           super_OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
                           SlotIndex1,
                     (uint)(pOVar4->
                           super_OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
                           SlotIndex2,pOVar4->profileId);
  return;
}

Assistant:

void
IRBuilder::BuildProfiledElementSlotI2(Js::OpCode newOpcode, uint32 offset)
{
    Assert(OpCodeAttr::IsProfiledOp(newOpcode));
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));
    auto layout = m_jnReader.GetLayout<Js::OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlotI2<SizePolicy>>>();

    if (!PHASE_OFF(Js::ClosureRegCheckPhase, m_func))
    {
        this->DoClosureRegCheck(layout->Value);
    }

    Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(newOpcode);
    BuildElementSlotI2(newOpcode, offset, layout->Value, layout->SlotIndex1, layout->SlotIndex2, layout->profileId);
}